

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Vec_Int_t * Gia_ManFindSharedInputs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *__ptr;
  int *__s;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  uVar2 = p->vCis->nSize;
  __ptr = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar6 = uVar2;
  }
  __ptr->nCap = uVar6;
  if (uVar6 == 0) {
    __ptr->pArray = (int *)0x0;
    __ptr->nSize = uVar2;
  }
  else {
    __s = (int *)malloc((long)(int)uVar6 << 2);
    __ptr->pArray = __s;
    __ptr->nSize = uVar2;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar2 * 4);
      goto LAB_00221bff;
    }
  }
  __s = (int *)0x0;
LAB_00221bff:
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      iVar7 = pVVar5->pArray[lVar9];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00221d68:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar7;
      Gia_ManIncrementTravId(p);
      Gia_ManMarkTfi_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff));
      pVVar5 = p->vCis;
      iVar7 = pVVar5->nSize;
      if (0 < iVar7) {
        piVar4 = pVVar5->pArray;
        lVar10 = 0;
        do {
          iVar3 = piVar4[lVar10];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00221d68;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (p->nTravIdsAlloc <= iVar3) {
            __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
          }
          if (p->pTravIds[iVar3] == p->nTravIds) {
            if ((int)uVar2 <= lVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            __s[lVar10] = __s[lVar10] + 1;
            iVar7 = pVVar5->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar7);
      }
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCos;
    } while (lVar9 < pVVar5->nSize);
  }
  if ((int)uVar2 < 1) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    uVar6 = 0;
    do {
      if (__s[uVar8] == pVVar5->nSize) {
        if (((int)uVar6 < 0) || (uVar2 <= uVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar11 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        __s[uVar11] = (int)uVar8;
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  if ((int)uVar2 < (int)uVar6) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  __ptr->nSize = uVar6;
  if (uVar6 == 0 || 10 < (int)uVar6) {
    if (__s != (int *)0x0) {
      free(__s);
    }
    free(__ptr);
    __ptr = (Vec_Int_t *)0x0;
  }
  return __ptr;
}

Assistant:

Vec_Int_t * Gia_ManFindSharedInputs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pObj2; int i, k, Value;
    Vec_Int_t * vRes = Vec_IntStart( Gia_ManCiNum(p) );
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManIncrementTravId( p );
        Gia_ManMarkTfi_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ManForEachCi( p, pObj2, k )
            if ( Gia_ObjIsTravIdCurrent(p, pObj2) )
                Vec_IntAddToEntry( vRes, k, 1 );
    }
    k = 0;
    Vec_IntForEachEntry( vRes, Value, i )
        if ( Value == Gia_ManCoNum(p) )
            Vec_IntWriteEntry( vRes, k++, i );
    Vec_IntShrink( vRes, k );
    //printf( "Found %d candidate inputs.\n", Vec_IntSize(vRes) );
    if ( Vec_IntSize(vRes) == 0 || Vec_IntSize(vRes) > 10 )
        Vec_IntFreeP(&vRes);
    return vRes;
}